

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Options::TestCaseOptionParser::parseIntoConfig
          (TestCaseOptionParser *this,Command *cmd,ConfigData *config)

{
  ulong uVar1;
  string groupName;
  TestCaseFilters filters;
  string local_100;
  TestCaseFilters local_e0;
  string local_78;
  TestCaseFilter local_58;
  
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(cmd->m_args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(cmd->m_args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      std::__cxx11::string::append((char *)&local_100);
    }
    Command::operator[][abi_cxx11_((string *)&local_e0,cmd,uVar1);
    std::__cxx11::string::append((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  TestCaseFilters::TestCaseFilters(&local_e0,&local_100);
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(cmd->m_args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(cmd->m_args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar1 = uVar1 + 1) {
    Command::operator[][abi_cxx11_(&local_78,cmd,uVar1);
    TestCaseFilter::TestCaseFilter(&local_58,&local_78,AutoDetectBehaviour);
    TestCaseFilters::addFilter(&local_e0,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
            (&config->filters,&local_e0);
  TestCaseFilters::~TestCaseFilters(&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  return;
}

Assistant:

virtual void parseIntoConfig( const Command& cmd, ConfigData& config ) {
                std::string groupName;
                for( std::size_t i = 0; i < cmd.argsCount(); ++i ) {
                    if( i != 0 )
                        groupName += " ";
                    groupName += cmd[i];
                }
                TestCaseFilters filters( groupName );
                for( std::size_t i = 0; i < cmd.argsCount(); ++i )
                    filters.addFilter( TestCaseFilter( cmd[i] ) );
                config.filters.push_back( filters );
            }